

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_dump.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  int local_20b4;
  dircnt_t *pdStack_20b0;
  int it_image;
  dircnt_t *dirptr;
  img_fol_t img_fol;
  OPJ_INT32 imageno;
  OPJ_INT32 num_images;
  opj_codestream_index_t *cstr_index;
  opj_codestream_info_v2_t *cstr_info;
  opj_stream_t *l_stream;
  opj_codec_t *l_codec;
  opj_image_t *image;
  opj_dparameters_t parameters;
  FILE *fout;
  char **argv_local;
  int argc_local;
  
  parameters.jpwl_max_tiles = 0;
  parameters.flags = 0;
  l_codec = (opj_codec_t *)0x0;
  l_stream = (opj_stream_t *)0x0;
  cstr_info = (opj_codestream_info_v2_t *)0x0;
  cstr_index = (opj_codestream_index_t *)0x0;
  _imageno = 0;
  pdStack_20b0 = (dircnt_t *)0x0;
  opj_set_default_decoder_parameters((long)&image + 4);
  memset(&dirptr,0,0x18);
  img_fol.out_format._4_4_ = 0x13;
  iVar2 = parse_cmdline_decoder
                    (argc,argv,(opj_dparameters_t *)((long)&image + 4),(img_fol_t *)&dirptr);
  if (iVar2 == 1) {
    if (dirptr != (dircnt_t *)0x0) {
      free(dirptr);
    }
    return 1;
  }
  if ((char)img_fol.out_format == '\x01') {
    img_fol.flag = get_num_images((char *)dirptr);
    pdStack_20b0 = (dircnt_t *)malloc(0x10);
    if (pdStack_20b0 == (dircnt_t *)0x0) {
      return 1;
    }
    pcVar3 = (char *)malloc((long)img_fol.flag << 0xc);
    pdStack_20b0->filename_buf = pcVar3;
    if (pdStack_20b0->filename_buf == (char *)0x0) {
      free(pdStack_20b0);
      return 1;
    }
    ppcVar4 = (char **)malloc((long)img_fol.flag << 3);
    pdStack_20b0->filename = ppcVar4;
    if (pdStack_20b0->filename != (char **)0x0) {
      for (local_20b4 = 0; local_20b4 < img_fol.flag; local_20b4 = local_20b4 + 1) {
        pdStack_20b0->filename[local_20b4] = pdStack_20b0->filename_buf + (local_20b4 << 0xc);
      }
      iVar2 = load_images(pdStack_20b0,(char *)dirptr);
      if (iVar2 != 1) {
        if (img_fol.flag != 0) goto LAB_00103923;
        fprintf(_stdout,"Folder is empty\n");
      }
    }
LAB_00103c9d:
    if (pdStack_20b0 != (dircnt_t *)0x0) {
      if (pdStack_20b0->filename != (char **)0x0) {
        free(pdStack_20b0->filename);
      }
      if (pdStack_20b0->filename_buf != (char *)0x0) {
        free(pdStack_20b0->filename_buf);
      }
      free(pdStack_20b0);
    }
    argv_local._4_4_ = 1;
  }
  else {
    img_fol.flag = 1;
LAB_00103923:
    if (parameters.infile[0xff8] == '\0') {
      parameters._8244_8_ = _stdout;
    }
    else {
      parameters._8244_8_ = fopen(parameters.infile + 0xff8,"w");
      if ((FILE *)parameters._8244_8_ == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",parameters.infile + 0xff8);
        goto LAB_00103c9d;
      }
    }
    img_fol.set_imgdir = '\0';
    img_fol.set_out_format = '\0';
    img_fol._18_2_ = 0;
    for (; (int)img_fol._16_4_ < img_fol.flag; img_fol._16_4_ = img_fol._16_4_ + 1) {
      fprintf(_stderr,"\n");
      if (((char)img_fol.out_format == '\x01') &&
         (cVar1 = get_next_file(img_fol._16_4_,pdStack_20b0,(img_fol_t *)&dirptr,
                                (opj_dparameters_t *)((long)&image + 4)), cVar1 != '\0')) {
        fprintf(_stderr,"skipping file...\n");
      }
      else {
        cstr_info = (opj_codestream_info_v2_t *)opj_stream_create_default_file_stream(&parameters,1)
        ;
        if (cstr_info == (opj_codestream_info_v2_t *)0x0) {
          fprintf(_stderr,"ERROR -> failed to create the stream from the file %s\n",&parameters);
          goto LAB_00103c9d;
        }
        if (parameters.outfile._4088_4_ == 0) {
          l_stream = (opj_stream_t *)opj_create_decompress(0);
        }
        else if (parameters.outfile._4088_4_ == 1) {
          l_stream = (opj_stream_t *)opj_create_decompress(2);
        }
        else {
          if (parameters.outfile._4088_4_ != 2) {
            fprintf(_stderr,"skipping file..\n");
            opj_stream_destroy(cstr_info);
            goto LAB_00103c77;
          }
          l_stream = (opj_stream_t *)opj_create_decompress(1);
        }
        opj_set_info_handler(l_stream,info_callback,0);
        opj_set_warning_handler(l_stream,warning_callback,0);
        opj_set_error_handler(l_stream,error_callback,0);
        parameters.jpwl_exp_comps = parameters.jpwl_exp_comps | 2;
        iVar2 = opj_setup_decoder(l_stream,(long)&image + 4);
        if (iVar2 == 0) {
          fprintf(_stderr,"ERROR -> opj_dump: failed to setup the decoder\n");
          opj_stream_destroy(cstr_info);
          opj_destroy_codec(l_stream);
          fclose((FILE *)parameters._8244_8_);
          goto LAB_00103c9d;
        }
        iVar2 = opj_read_header(cstr_info,l_stream,&l_codec);
        if (iVar2 == 0) {
          fprintf(_stderr,"ERROR -> opj_dump: failed to read the header\n");
          opj_stream_destroy(cstr_info);
          opj_destroy_codec(l_stream);
          opj_image_destroy(l_codec);
          fclose((FILE *)parameters._8244_8_);
          goto LAB_00103c9d;
        }
        opj_dump_codec(l_stream,img_fol.out_format._4_4_,parameters._8244_8_);
        cstr_index = (opj_codestream_index_t *)opj_get_cstr_info(l_stream);
        _imageno = opj_get_cstr_index(l_stream);
        opj_stream_destroy(cstr_info);
        if (l_stream != (opj_stream_t *)0x0) {
          opj_destroy_codec(l_stream);
        }
        opj_image_destroy(l_codec);
        opj_destroy_cstr_index(&imageno);
        opj_destroy_cstr_info(&cstr_index);
      }
LAB_00103c77:
    }
    fclose((FILE *)parameters._8244_8_);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    FILE *fout = NULL;

    opj_dparameters_t parameters;           /* Decompression parameters */
    opj_image_t* image = NULL;                  /* Image structure */
    opj_codec_t* l_codec = NULL;                /* Handle to a decompressor */
    opj_stream_t *l_stream = NULL;              /* Stream */
    opj_codestream_info_v2_t* cstr_info = NULL;
    opj_codestream_index_t* cstr_index = NULL;

    OPJ_INT32 num_images, imageno;
    img_fol_t img_fol;
    dircnt_t *dirptr = NULL;

    /* Set decoding parameters to default values */
    opj_set_default_decoder_parameters(&parameters);

    /* Initialize img_fol */
    memset(&img_fol, 0, sizeof(img_fol_t));
    img_fol.flag = OPJ_IMG_INFO | OPJ_J2K_MH_INFO | OPJ_J2K_MH_IND;

    /* Parse input and get user encoding parameters */
    if (parse_cmdline_decoder(argc, argv, &parameters, &img_fol) == 1) {
        if (img_fol.imgdirpath) {
            free(img_fol.imgdirpath);
        }

        return EXIT_FAILURE;
    }

    /* Initialize reading of directory */
    if (img_fol.set_imgdir == 1) {
        int it_image;
        num_images = get_num_images(img_fol.imgdirpath);

        dirptr = (dircnt_t*)malloc(sizeof(dircnt_t));
        if (!dirptr) {
            return EXIT_FAILURE;
        }
        dirptr->filename_buf = (char*)malloc((size_t)num_images * OPJ_PATH_LEN * sizeof(
                char)); /* Stores at max 10 image file names*/
        if (!dirptr->filename_buf) {
            free(dirptr);
            return EXIT_FAILURE;
        }
        dirptr->filename = (char**) malloc((size_t)num_images * sizeof(char*));

        if (!dirptr->filename) {
            goto fails;
        }

        for (it_image = 0; it_image < num_images; it_image++) {
            dirptr->filename[it_image] = dirptr->filename_buf + it_image * OPJ_PATH_LEN;
        }

        if (load_images(dirptr, img_fol.imgdirpath) == 1) {
            goto fails;
        }

        if (num_images == 0) {
            fprintf(stdout, "Folder is empty\n");
            goto fails;
        }
    } else {
        num_images = 1;
    }

    /* Try to open for writing the output file if necessary */
    if (parameters.outfile[0] != 0) {
        fout = fopen(parameters.outfile, "w");
        if (!fout) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", parameters.outfile);
            goto fails;
        }
    } else {
        fout = stdout;
    }

    /* Read the header of each image one by one */
    for (imageno = 0; imageno < num_images ; imageno++) {

        fprintf(stderr, "\n");

        if (img_fol.set_imgdir == 1) {
            if (get_next_file(imageno, dirptr, &img_fol, &parameters)) {
                fprintf(stderr, "skipping file...\n");
                continue;
            }
        }

        /* Read the input file and put it in memory */
        /* ---------------------------------------- */

        l_stream = opj_stream_create_default_file_stream(parameters.infile, 1);
        if (!l_stream) {
            fprintf(stderr, "ERROR -> failed to create the stream from the file %s\n",
                    parameters.infile);
            goto fails;
        }

        /* Read the JPEG2000 stream */
        /* ------------------------ */

        switch (parameters.decod_format) {
        case J2K_CFMT: { /* JPEG-2000 codestream */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_J2K);
            break;
        }
        case JP2_CFMT: { /* JPEG 2000 compressed image data */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_JP2);
            break;
        }
        case JPT_CFMT: { /* JPEG 2000, JPIP */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_JPT);
            break;
        }
        default:
            fprintf(stderr, "skipping file..\n");
            opj_stream_destroy(l_stream);
            continue;
        }

        /* catch events using our callbacks and give a local context */
        opj_set_info_handler(l_codec, info_callback, 00);
        opj_set_warning_handler(l_codec, warning_callback, 00);
        opj_set_error_handler(l_codec, error_callback, 00);

        parameters.flags |= OPJ_DPARAMETERS_DUMP_FLAG;

        /* Setup the decoder decoding parameters using user parameters */
        if (!opj_setup_decoder(l_codec, &parameters)) {
            fprintf(stderr, "ERROR -> opj_dump: failed to setup the decoder\n");
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            fclose(fout);
            goto fails;
        }

        /* Read the main header of the codestream and if necessary the JP2 boxes*/
        if (! opj_read_header(l_stream, l_codec, &image)) {
            fprintf(stderr, "ERROR -> opj_dump: failed to read the header\n");
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            fclose(fout);
            goto fails;
        }

        opj_dump_codec(l_codec, img_fol.flag, fout);

        cstr_info = opj_get_cstr_info(l_codec);

        cstr_index = opj_get_cstr_index(l_codec);

        /* close the byte stream */
        opj_stream_destroy(l_stream);

        /* free remaining structures */
        if (l_codec) {
            opj_destroy_codec(l_codec);
        }

        /* destroy the image header */
        opj_image_destroy(image);

        /* destroy the codestream index */
        opj_destroy_cstr_index(&cstr_index);

        /* destroy the codestream info */
        opj_destroy_cstr_info(&cstr_info);

    }

    /* Close the output file */
    fclose(fout);

    return EXIT_SUCCESS;

fails:
    if (dirptr) {
        if (dirptr->filename) {
            free(dirptr->filename);
        }
        if (dirptr->filename_buf) {
            free(dirptr->filename_buf);
        }
        free(dirptr);
    }
    return EXIT_FAILURE;
}